

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample2DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,float t,
          IVec3 *offset)

{
  WrapMode WVar1;
  WrapMode WVar2;
  FilterMode FVar3;
  int iVar4;
  WrapMode WVar5;
  bool bVar6;
  float afVar7 [4];
  undefined1 auVar8 [16];
  Sampler *sampler_00;
  TextureChannelClass TVar9;
  FilterMode FVar10;
  int iVar11;
  uint uVar12;
  undefined4 in_register_00000014;
  Sampler *sampler_01;
  FilterMode FVar13;
  FilterMode FVar14;
  IVec3 *in_R8;
  WrapMode WVar15;
  WrapMode WVar16;
  FilterMode FVar17;
  int iVar18;
  Vector<float,_4> *res_6;
  ConstPixelBufferAccess *pCVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 in_register_00001244 [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Vec4 VVar35;
  Vec4 VVar36;
  Vec4 p11;
  Vec4 p01;
  Vec4 p10;
  Vec4 p00;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  TextureFormat local_a8;
  uint uStack_a0;
  uint uStack_9c;
  WrapMode local_94;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  Sampler *local_38;
  Vec4 VVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  ulong uVar29;
  
  auVar30._4_12_ = in_register_00001244;
  auVar30._0_4_ = t;
  uVar29 = auVar30._0_8_;
  sampler_01 = (Sampler *)CONCAT44(in_register_00000014,filter);
  if (sampler_01->normalizedCoords == true) {
    WVar1 = sampler_01->wrapS;
    fVar23 = 0.0;
    if (WVar1 < WRAPMODE_LAST) {
      fVar23 = (float)(int)sampler->wrapR;
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        if (WVar1 == REPEAT_CL) {
          fVar24 = floorf(s);
          fVar23 = (s - fVar24) * fVar23;
        }
        else {
          fVar25 = s * 0.5;
          fVar24 = floorf(fVar25);
          if ((fVar25 - fVar24 != 0.5) || (NAN(fVar25 - fVar24))) {
            fVar24 = floorf(fVar25 + 0.5);
          }
          else {
            fVar24 = 0.0;
            if (((long)(fVar25 + -0.5) & 1U) != 0) {
              fVar24 = 1.0;
            }
            fVar24 = fVar25 + -0.5 + fVar24;
          }
          fVar24 = s - (fVar24 + fVar24);
          uVar12 = -(uint)(-fVar24 <= fVar24);
          fVar23 = (float)(~uVar12 & (uint)-fVar24 | (uint)fVar24 & uVar12) * fVar23;
        }
      }
      else {
        fVar23 = fVar23 * s;
      }
    }
    WVar1 = sampler_01->wrapT;
    s = fVar23;
    if (WVar1 < WRAPMODE_LAST) {
      fVar23 = (float)(int)sampler->minFilter;
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        if (WVar1 == REPEAT_CL) {
          fVar24 = floorf(t);
          auVar32._0_4_ = (t - fVar24) * fVar23;
          auVar32._4_12_ = in_register_00001244;
          uVar29 = auVar32._0_8_;
        }
        else {
          fVar24 = t * 0.5;
          fVar25 = floorf(fVar24);
          if ((fVar24 - fVar25 != 0.5) || (NAN(fVar24 - fVar25))) {
            fVar25 = floorf(fVar24 + 0.5);
          }
          else {
            fVar25 = 0.0;
            if (((long)(fVar24 + -0.5) & 1U) != 0) {
              fVar25 = 1.0;
            }
            fVar25 = fVar24 + -0.5 + fVar25;
          }
          uStack_d4 = in_register_00001244._0_4_;
          uStack_d0 = in_register_00001244._4_4_;
          uStack_cc = in_register_00001244._8_4_;
          fVar24 = t - (fVar25 + fVar25);
          uVar12 = -(uint)(-fVar24 <= fVar24);
          auVar33._4_4_ = uStack_d4 & (uStack_d4 ^ 0x80000000);
          auVar33._0_4_ = (uint)fVar24 & uVar12;
          auVar33._8_4_ = uStack_d0 & (uStack_d0 ^ 0x80000000);
          auVar33._12_4_ = uStack_cc & (uStack_cc ^ 0x80000000);
          auVar33 = ZEXT416(~uVar12 & (uint)-fVar24) | auVar33;
          auVar34._4_12_ = auVar33._4_12_;
          auVar34._0_4_ = auVar33._0_4_ * fVar23;
          uVar29 = auVar34._0_8_;
        }
      }
      else {
        auVar31._0_4_ = t * fVar23;
        auVar31._4_12_ = in_register_00001244;
        uVar29 = auVar31._0_8_;
      }
    }
    else {
      uVar29 = 0;
    }
  }
  if ((int)offset == 0) {
    VVar35 = sampleNearest2D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_01,s,
                             (float)uVar29,in_R8);
    VVar35.m_data[0] = VVar35.m_data[0];
    VVar36.m_data[1] = VVar35.m_data[1];
    register0x00001240 = VVar35.m_data[2];
    register0x00001244 = VVar35.m_data[3];
    return (Vec4)VVar35.m_data;
  }
  if ((int)offset != 1) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar29;
    afVar7 = (float  [4])(auVar8 << 0x40);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    VVar37.m_data[0] = afVar7[0];
    VVar36.m_data[1] = afVar7[1];
    register0x00001240 = afVar7[2];
    register0x00001244 = afVar7[3];
    return (Vec4)VVar37.m_data;
  }
  WVar2 = sampler->wrapR;
  FVar3 = sampler->minFilter;
  local_58._24_8_ = this;
  local_38 = sampler;
  local_8c = floorf(s + -0.5);
  iVar18 = (int)local_8c;
  iVar11 = in_R8->m_data[0];
  iVar4 = in_R8->m_data[1];
  WVar1 = iVar11 + 1 + iVar18;
  fVar23 = (float)uVar29 + -0.5;
  local_90 = floorf(fVar23);
  sampler_00 = local_38;
  WVar5 = sampler_01->wrapS;
  local_94 = CLAMP_TO_EDGE;
  if (MIRRORED_ONCE < WVar5) goto LAB_00a7f73e;
  WVar16 = iVar11 + iVar18;
  switch(WVar5) {
  case CLAMP_TO_EDGE:
    WVar15 = WVar2 - CLAMP_TO_BORDER;
    local_94 = WVar15;
    if ((int)WVar16 < (int)WVar15) {
      local_94 = WVar16;
    }
    if ((int)WVar16 < 0) {
      local_94 = CLAMP_TO_EDGE;
    }
    if ((int)WVar1 < (int)WVar15) {
      WVar15 = WVar1;
    }
    if ((int)WVar1 < 0) {
      WVar15 = CLAMP_TO_EDGE;
    }
    break;
  case CLAMP_TO_BORDER:
    local_94 = WVar2;
    if ((int)WVar16 < (int)WVar2) {
      local_94 = WVar16;
    }
    if ((int)WVar16 < -1) {
      local_94 = ~CLAMP_TO_EDGE;
    }
    WVar15 = WVar2;
    if ((int)WVar1 < (int)WVar2) {
      WVar15 = WVar1;
    }
    if ((int)WVar1 < -1) {
      WVar15 = ~CLAMP_TO_EDGE;
    }
    break;
  default:
    local_94 = ((int)WVar16 % (int)WVar2 >> 0x1f & WVar2) + (int)WVar16 % (int)WVar2;
    WVar15 = ((int)WVar1 % (int)WVar2 >> 0x1f & WVar2) + (int)WVar1 % (int)WVar2;
    break;
  case MIRRORED_REPEAT_GL:
    WVar15 = WVar16;
    goto LAB_00a7f71a;
  case MIRRORED_REPEAT_CL:
    WVar15 = WVar2 - CLAMP_TO_BORDER;
    if ((int)WVar16 < (int)(WVar2 - CLAMP_TO_BORDER)) {
      WVar15 = WVar16;
    }
    local_94 = CLAMP_TO_EDGE;
    if (-1 < (int)WVar16) {
      local_94 = WVar15;
    }
    goto LAB_00a7f756;
  case MIRRORED_ONCE:
    WVar15 = WVar2;
    if ((int)WVar16 < (int)WVar2) {
      WVar15 = WVar16;
    }
    if (SBORROW4(WVar16,-WVar2) != (int)(WVar16 + WVar2) < 0) {
      WVar15 = -WVar2;
    }
LAB_00a7f71a:
    iVar11 = (int)WVar15 % (int)(WVar2 * 2);
    uVar12 = (iVar11 - WVar2) + (iVar11 >> 0x1f & WVar2 * 2);
    local_94 = ~((int)uVar12 >> 0x1f ^ uVar12) + WVar2;
LAB_00a7f73e:
    WVar16 = WVar1;
    if (WVar5 != MIRRORED_REPEAT_GL) {
      if (WVar5 != MIRRORED_ONCE) {
        WVar15 = CLAMP_TO_EDGE;
        if (WVar5 == MIRRORED_REPEAT_CL) {
LAB_00a7f756:
          WVar16 = WVar2 - CLAMP_TO_BORDER;
          if ((int)WVar1 < (int)(WVar2 - CLAMP_TO_BORDER)) {
            WVar16 = WVar1;
          }
          WVar15 = CLAMP_TO_EDGE;
          if (-1 < (int)WVar1) {
            WVar15 = WVar16;
          }
        }
        break;
      }
      WVar16 = WVar2;
      if ((int)WVar1 < (int)WVar2) {
        WVar16 = WVar1;
      }
      if (SBORROW4(WVar1,-WVar2) != (int)(WVar1 + WVar2) < 0) {
        WVar16 = -WVar2;
      }
    }
    iVar11 = (int)WVar16 % (int)(WVar2 * 2);
    uVar12 = (iVar11 - WVar2) + (iVar11 >> 0x1f & WVar2 * 2);
    WVar15 = ~((int)uVar12 >> 0x1f ^ uVar12) + WVar2;
  }
  FVar10 = (int)local_90 + iVar4 + LINEAR;
  WVar1 = sampler_01->wrapT;
  FVar17 = NEAREST;
  if (WVar1 < WRAPMODE_LAST) {
    FVar14 = iVar4 + (int)local_90;
    FVar17 = FVar14;
    switch(WVar1) {
    case CLAMP_TO_EDGE:
      FVar13 = FVar3 - LINEAR;
      FVar17 = FVar13;
      if ((int)FVar14 < (int)FVar13) {
        FVar17 = FVar14;
      }
      if ((int)FVar14 < 0) {
        FVar17 = NEAREST;
      }
      if ((int)FVar10 < (int)FVar13) {
        FVar13 = FVar10;
      }
      if ((int)FVar10 < 0) {
        FVar13 = NEAREST;
      }
      break;
    case CLAMP_TO_BORDER:
      FVar17 = FVar3;
      if ((int)FVar14 < (int)FVar3) {
        FVar17 = FVar14;
      }
      if ((int)FVar14 < -1) {
        FVar17 = ~NEAREST;
      }
      FVar13 = FVar3;
      if ((int)FVar10 < (int)FVar3) {
        FVar13 = FVar10;
      }
      if ((int)FVar10 < -1) {
        FVar13 = ~NEAREST;
      }
      break;
    default:
      FVar17 = ((int)FVar14 % (int)FVar3 >> 0x1f & FVar3) + (int)FVar14 % (int)FVar3;
      FVar13 = ((int)FVar10 % (int)FVar3 >> 0x1f & FVar3) + (int)FVar10 % (int)FVar3;
      break;
    case MIRRORED_REPEAT_CL:
      FVar13 = FVar3 - LINEAR;
      if ((int)FVar14 < (int)(FVar3 - LINEAR)) {
        FVar13 = FVar14;
      }
      FVar17 = NEAREST;
      if (-1 < (int)FVar14) {
        FVar17 = FVar13;
      }
LAB_00a7f8af:
      FVar14 = FVar3 - LINEAR;
      if ((int)FVar10 < (int)(FVar3 - LINEAR)) {
        FVar14 = FVar10;
      }
      FVar13 = NEAREST;
      if (-1 < (int)FVar10) {
        FVar13 = FVar14;
      }
      break;
    case MIRRORED_ONCE:
      FVar17 = FVar3;
      if ((int)FVar14 < (int)FVar3) {
        FVar17 = FVar14;
      }
      if (SBORROW4(FVar14,-FVar3) != (int)(FVar14 + FVar3) < 0) {
        FVar17 = -FVar3;
      }
    case MIRRORED_REPEAT_GL:
      iVar11 = (int)FVar17 % (int)(FVar3 * 2);
      uVar12 = (iVar11 - FVar3) + (iVar11 >> 0x1f & FVar3 * 2);
      FVar17 = ~((int)uVar12 >> 0x1f ^ uVar12) + FVar3;
      goto LAB_00a7f89c;
    }
  }
  else {
LAB_00a7f89c:
    FVar14 = FVar10;
    if (WVar1 != MIRRORED_REPEAT_GL) {
      if (WVar1 != MIRRORED_ONCE) {
        FVar13 = NEAREST;
        if (WVar1 == MIRRORED_REPEAT_CL) goto LAB_00a7f8af;
        goto LAB_00a7f8f5;
      }
      FVar14 = FVar3;
      if ((int)FVar10 < (int)FVar3) {
        FVar14 = FVar10;
      }
      if (SBORROW4(FVar10,-FVar3) != (int)(FVar10 + FVar3) < 0) {
        FVar14 = -FVar3;
      }
    }
    iVar11 = (int)FVar14 % (int)(FVar3 * 2);
    uVar12 = (iVar11 - FVar3) + (iVar11 >> 0x1f & FVar3 * 2);
    FVar13 = ~((int)uVar12 >> 0x1f ^ uVar12) + FVar3;
  }
LAB_00a7f8f5:
  bVar20 = WVar5 != CLAMP_TO_BORDER;
  bVar22 = -1 < (int)local_94;
  bVar6 = (int)local_94 < (int)WVar2;
  bVar21 = WVar1 != CLAMP_TO_BORDER;
  iVar11 = (int)local_38;
  if ((bVar20 || bVar6 && bVar22) && (bVar21 || (int)FVar17 < (int)FVar3 && -1 < (int)FVar17)) {
    lookup((ConstPixelBufferAccess *)local_58,iVar11,local_94,FVar17);
  }
  else {
    TVar9 = getTextureChannelClass(local_38->wrapT);
    switch(TVar9) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_58,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_a8,sampler_00);
      local_58._0_4_ = (undefined4)(int)local_a8.order;
      local_58._4_4_ = (undefined4)(int)local_a8.type;
      local_58._8_4_ = (undefined4)(int)uStack_a0;
      local_58._12_4_ = (undefined4)(int)uStack_9c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_a8,sampler_00);
      local_58._0_4_ =
           ((float)(local_a8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_a8.order & 0xffff | 0x4b000000);
      local_58._4_4_ =
           ((float)(local_a8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_a8.type & 0xffff | 0x4b000000);
      local_58._8_4_ =
           ((float)(uStack_a0 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_a0 & 0xffff | 0x4b000000);
      local_58._12_4_ =
           ((float)(uStack_9c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_9c & 0xffff | 0x4b000000);
      break;
    default:
      local_58._0_4_ = -1.0;
      local_58._4_4_ = -1.0;
      local_58._8_4_ = -1.0;
      local_58._12_4_ = -1.0;
    }
  }
  if ((bVar21 || (int)FVar17 < (int)FVar3 && -1 < (int)FVar17) &&
      (bVar20 || (int)WVar15 < (int)WVar2 && -1 < (int)WVar15)) {
    lookup((ConstPixelBufferAccess *)local_68,iVar11,WVar15,FVar17);
    goto LAB_00a7fb2a;
  }
  TVar9 = getTextureChannelClass(sampler_00->wrapT);
  switch(TVar9) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    sampleTextureBorder<float>((TextureFormat *)local_68,sampler_00);
    goto LAB_00a7fb2a;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    sampleTextureBorder<int>(&local_a8,sampler_00);
    local_68._0_4_ = (undefined4)(int)local_a8.order;
    local_68._4_4_ = (undefined4)(int)local_a8.type;
    local_68._8_4_ = (undefined4)(int)uStack_a0;
    local_68._12_4_ = (undefined4)(int)uStack_9c;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    sampleTextureBorder<unsigned_int>(&local_a8,sampler_00);
    local_68._0_4_ =
         ((float)(local_a8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_a8.order & 0xffff | 0x4b000000);
    local_68._4_4_ =
         ((float)(local_a8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(local_a8.type & 0xffff | 0x4b000000);
    local_68._8_4_ =
         ((float)(uStack_a0 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_a0 & 0xffff | 0x4b000000);
    local_68._12_4_ =
         ((float)(uStack_9c >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uStack_9c & 0xffff | 0x4b000000);
    break;
  default:
    local_68._0_4_ = 0xbf800000;
    local_68._4_4_ = 0xbf800000;
    local_68._8_4_ = -0x40800000;
    local_68._12_4_ = -0x40800000;
    goto LAB_00a7fb2a;
  }
LAB_00a7fb2a:
  if ((bVar20 || bVar6 && bVar22) && (bVar21 || (int)FVar13 < (int)FVar3 && -1 < (int)FVar13)) {
    lookup((ConstPixelBufferAccess *)local_78,iVar11,local_94,FVar13);
    pCVar19 = (ConstPixelBufferAccess *)local_58._24_8_;
  }
  else {
    TVar9 = getTextureChannelClass(sampler_00->wrapT);
    pCVar19 = (ConstPixelBufferAccess *)local_58._24_8_;
    switch(TVar9) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_78,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_a8,sampler_00);
      local_78._0_4_ = (undefined4)(int)local_a8.order;
      local_78._4_4_ = (undefined4)(int)local_a8.type;
      local_78._8_4_ = (undefined4)(int)uStack_a0;
      local_78._12_4_ = (undefined4)(int)uStack_9c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_a8,sampler_00);
      local_78._0_4_ =
           ((float)(local_a8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_a8.order & 0xffff | 0x4b000000);
      local_78._4_4_ =
           ((float)(local_a8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_a8.type & 0xffff | 0x4b000000);
      local_78._8_4_ =
           ((float)(uStack_a0 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_a0 & 0xffff | 0x4b000000);
      local_78._12_4_ =
           ((float)(uStack_9c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_9c & 0xffff | 0x4b000000);
      break;
    default:
      local_78._0_4_ = -1.0;
      local_78._4_4_ = -1.0;
      local_78._8_4_ = -1.0;
      local_78._12_4_ = -1.0;
    }
  }
  fVar24 = (s + -0.5) - local_8c;
  fVar23 = fVar23 - local_90;
  if ((bVar20 || (int)WVar15 < (int)WVar2 && -1 < (int)WVar15) &&
      (bVar21 || (int)FVar13 < (int)FVar3 && -1 < (int)FVar13)) {
    lookup((ConstPixelBufferAccess *)local_88,iVar11,WVar15,FVar13);
  }
  else {
    TVar9 = getTextureChannelClass(sampler_00->wrapT);
    switch(TVar9) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      sampleTextureBorder<float>((TextureFormat *)local_88,sampler_00);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      sampleTextureBorder<int>(&local_a8,sampler_00);
      local_88._0_4_ = (undefined4)(int)local_a8.order;
      local_88._4_4_ = (undefined4)(int)local_a8.type;
      local_88._8_4_ = (undefined4)(int)uStack_a0;
      local_88._12_4_ = (undefined4)(int)uStack_9c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      sampleTextureBorder<unsigned_int>(&local_a8,sampler_00);
      local_88._0_4_ =
           ((float)(local_a8.order >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_a8.order & 0xffff | 0x4b000000);
      local_88._4_4_ =
           ((float)(local_a8.type >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(local_a8.type & 0xffff | 0x4b000000);
      local_88._8_4_ =
           ((float)(uStack_a0 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_a0 & 0xffff | 0x4b000000);
      local_88._12_4_ =
           ((float)(uStack_9c >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uStack_9c & 0xffff | 0x4b000000);
      break;
    default:
      local_88._0_4_ = -1.0;
      local_88._4_4_ = -1.0;
      local_88._8_4_ = -1.0;
      local_88._12_4_ = -1.0;
    }
  }
  fVar25 = 1.0 - fVar24;
  fVar28 = 1.0 - fVar23;
  fVar26 = fVar25 * (float)local_78._0_4_ * fVar23 +
           (float)local_68._0_4_ * fVar24 * fVar28 + (float)local_58._0_4_ * fVar25 * fVar28;
  fVar27 = fVar25 * (float)local_78._4_4_ * fVar23 +
           (float)local_68._4_4_ * fVar24 * fVar28 + (float)local_58._4_4_ * fVar25 * fVar28;
  (pCVar19->m_format).order = (ChannelOrder)(fVar24 * (float)local_88._0_4_ * fVar23 + fVar26);
  (pCVar19->m_format).type = (ChannelType)(fVar24 * (float)local_88._4_4_ * fVar23 + fVar27);
  (pCVar19->m_size).m_data[0] =
       (int)(fVar24 * (float)local_88._8_4_ * fVar23 +
            fVar25 * (float)local_78._8_4_ * fVar23 +
            (float)local_68._8_4_ * fVar24 * fVar28 + (float)local_58._8_4_ * fVar25 * fVar28);
  (pCVar19->m_size).m_data[1] =
       (int)(fVar24 * (float)local_88._12_4_ * fVar23 +
            fVar25 * (float)local_78._12_4_ * fVar23 +
            (float)local_68._12_4_ * fVar24 * fVar28 + (float)local_58._12_4_ * fVar25 * fVar28);
  VVar36.m_data[0] = fVar26;
  VVar36.m_data[1] = fVar27;
  register0x00001240 = fVar28;
  register0x00001244 = fVar28;
  return (Vec4)VVar36.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample2DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, float t, const IVec3& offset) const
{
	// check selected layer exists
	// \note offset.xy is the XY offset, offset.z is the selected layer
	DE_ASSERT(de::inBounds(offset.z(), 0, m_size.z()));

	// Non-normalized coordinates.
	float u = s;
	float v = t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest2D	(*this, sampler, u, v, offset);
		case Sampler::LINEAR:	return sampleLinear2D	(*this, sampler, u, v, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}